

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,char *outEncoding,char *docVersion,XMLFormatTarget *target,
          EscapeFlags escapeFlags,UnRepFlags unrepFlags,MemoryManager *manager)

{
  XMLCh XVar1;
  XMLCh XVar2;
  MemoryManager *manager_00;
  XMLCh *pXVar3;
  XMLTranscoder *pXVar4;
  XMLCh *pXVar5;
  TranscodingException *this_00;
  bool bVar6;
  Codes resCode;
  ArrayJanitor<char16_t> jname;
  Codes local_2c;
  ArrayJanitor<char16_t> local_28;
  
  this->fEscapeFlags = escapeFlags;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = target;
  this->fUnRepFlags = unrepFlags;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = manager;
  pXVar3 = XMLString::transcode(outEncoding,manager);
  this->fOutEncoding = pXVar3;
  pXVar4 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,pXVar3,&local_2c,0x4000,this->fMemoryManager)
  ;
  this->fXCoder = pXVar4;
  manager_00 = this->fMemoryManager;
  if (pXVar4 == (XMLTranscoder *)0x0) {
    (*manager_00->_vptr_MemoryManager[4])(manager_00,this->fOutEncoding);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
               ,0xbb,Trans_CantCreateCvtrFor,outEncoding,(char *)0x0,(char *)0x0,(char *)0x0,
               this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
  }
  pXVar3 = XMLString::transcode(docVersion,manager_00);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_28,pXVar3,this->fMemoryManager);
  if (pXVar3 == L"1.1") {
    bVar6 = true;
  }
  else {
    pXVar5 = L"1.1";
    if (pXVar3 == (XMLCh *)0x0) {
LAB_0029a120:
      bVar6 = *pXVar5 == L'\0';
    }
    else {
      do {
        XVar1 = *pXVar3;
        if (XVar1 == L'\0') goto LAB_0029a120;
        pXVar3 = pXVar3 + 1;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
      bVar6 = false;
    }
  }
  this->fIsXML11 = bVar6;
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_28);
  return;
}

Assistant:

XMLFormatter::XMLFormatter( const   char* const             outEncoding
                            , const char* const             docVersion
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // Transcode the encoding string
    fOutEncoding = XMLString::transcode(outEncoding, fMemoryManager);

    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fOutEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        fMemoryManager->deallocate(fOutEncoding); //delete [] fOutEncoding;
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    XMLCh* const tmpDocVer = XMLString::transcode(docVersion, fMemoryManager);
    ArrayJanitor<XMLCh> jname(tmpDocVer, fMemoryManager);
    fIsXML11 = XMLString::equals(tmpDocVer, XMLUni::fgVersion1_1);
}